

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O2

int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og,int force,int nfill)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  uint *__dest;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  
  puVar3 = os->body_data;
  uVar4 = os->lacing_fill;
  uVar14 = 0xff;
  if ((long)uVar4 < 0xff) {
    uVar14 = uVar4;
  }
  iVar9 = (int)uVar14;
  if (iVar9 == 0 || puVar3 == (uchar *)0x0) {
    return 0;
  }
  iVar1 = os->b_o_s;
  if (iVar1 == 0) {
    uVar7 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar9 < 1) {
      uVar14 = uVar7;
    }
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if ((char)os->lacing_vals[uVar12] != -1) {
        uVar7 = 0;
        uVar14 = (ulong)((int)uVar12 + 1);
        break;
      }
    }
  }
  else {
    uVar12 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar9 < 1) {
      uVar14 = uVar12;
    }
    uVar7 = 0xffffffffffffffff;
    lVar13 = 0;
    iVar8 = 0;
    iVar9 = 0;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if ((nfill < lVar13) && (3 < iVar9)) {
        uVar14 = uVar12 & 0xffffffff;
        force = 1;
        break;
      }
      iVar9 = 0;
      if ((ulong)*(byte *)(os->lacing_vals + uVar12) != 0xff) {
        uVar7 = os->granule_vals[uVar12];
        iVar8 = iVar8 + 1;
        iVar9 = iVar8;
      }
      lVar13 = lVar13 + (ulong)*(byte *)(os->lacing_vals + uVar12);
    }
    uVar11 = 0xff;
    if ((int)uVar14 == 0xff) goto LAB_001c4d41;
  }
  uVar11 = (uint)uVar14;
  if (force == 0) {
    return 0;
  }
LAB_001c4d41:
  builtin_memcpy(os->header,"OggS",5);
  os->header[5] = '\0';
  __dest = (uint *)os->lacing_vals;
  bVar15 = (*__dest >> 8 & 1) == 0;
  bVar5 = bVar15 + 2;
  if (iVar1 != 0) {
    bVar5 = bVar15;
  }
  os->header[5] = bVar5;
  uVar14 = (ulong)(int)uVar11;
  if ((os->e_o_s != 0) && (uVar4 == uVar14)) {
    os->header[5] = bVar5 | 4;
  }
  os->b_o_s = 1;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    os->header[lVar13 + 6] = (uchar)uVar7;
    uVar7 = (long)uVar7 >> 8;
  }
  lVar13 = os->serialno;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    os->header[lVar10 + 0xe] = (uchar)lVar13;
    lVar13 = lVar13 >> 8;
  }
  lVar10 = 0;
  lVar13 = os->pageno;
  if (os->pageno == -1) {
    lVar13 = lVar10;
  }
  os->pageno = lVar13 + 1;
  for (; lVar10 != 4; lVar10 = lVar10 + 1) {
    os->header[lVar10 + 0x12] = (uchar)lVar13;
    lVar13 = lVar13 >> 8;
  }
  os->header[0x16] = '\0';
  os->header[0x17] = '\0';
  os->header[0x18] = '\0';
  os->header[0x19] = '\0';
  os->header[0x1a] = (uchar)uVar11;
  uVar7 = 0;
  uVar12 = 0;
  if (0 < (int)uVar11) {
    uVar12 = (ulong)uVar11;
  }
  uVar6 = 0;
  for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    uVar2 = __dest[uVar7];
    os->header[uVar7 + 0x1b] = (uchar)uVar2;
    uVar6 = uVar6 + (uVar2 & 0xff);
  }
  og->header = os->header;
  os->header_fill = uVar11 + 0x1b;
  og->header_len = (long)(int)(uVar11 + 0x1b);
  og->body = puVar3 + os->body_returned;
  og->body_len = (ulong)uVar6;
  os->lacing_fill = uVar4 - uVar14;
  memmove(__dest,__dest + uVar14,(uVar4 - uVar14) * 4);
  memmove(os->granule_vals,os->granule_vals + uVar14,os->lacing_fill << 3);
  os->body_returned = os->body_returned + (ulong)uVar6;
  ogg_page_checksum_set(og);
  return 1;
}

Assistant:

static int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og, int force, int nfill){
  int i;
  int vals=0;
  int maxvals=(os->lacing_fill>255?255:os->lacing_fill);
  int bytes=0;
  long acc=0;
  ogg_int64_t granule_pos=-1;

  if(ogg_stream_check(os)) return(0);
  if(maxvals==0) return(0);

  /* construct a page */
  /* decide how many segments to include */

  /* If this is the initial header case, the first page must only include
     the initial header packet */
  if(os->b_o_s==0){  /* 'initial header page' case */
    granule_pos=0;
    for(vals=0;vals<maxvals;vals++){
      if((os->lacing_vals[vals]&0x0ff)<255){
        vals++;
        break;
      }
    }
  }else{

    /* The extra packets_done, packet_just_done logic here attempts to do two things:
       1) Don't unnecessarily span pages.
       2) Unless necessary, don't flush pages if there are less than four packets on
          them; this expands page size to reduce unnecessary overhead if incoming packets
          are large.
       These are not necessary behaviors, just 'always better than naive flushing'
       without requiring an application to explicitly request a specific optimized
       behavior. We'll want an explicit behavior setup pathway eventually as well. */

    int packets_done=0;
    int packet_just_done=0;
    for(vals=0;vals<maxvals;vals++){
      if(acc>nfill && packet_just_done>=4){
        force=1;
        break;
      }
      acc+=os->lacing_vals[vals]&0x0ff;
      if((os->lacing_vals[vals]&0xff)<255){
        granule_pos=os->granule_vals[vals];
        packet_just_done=++packets_done;
      }else
        packet_just_done=0;
    }
    if(vals==255)force=1;
  }

  if(!force) return(0);

  /* construct the header in temp storage */
  memcpy(os->header,"OggS",4);

  /* stream structure version */
  os->header[4]=0x00;

  /* continued packet flag? */
  os->header[5]=0x00;
  if((os->lacing_vals[0]&0x100)==0)os->header[5]|=0x01;
  /* first page flag? */
  if(os->b_o_s==0)os->header[5]|=0x02;
  /* last page flag? */
  if(os->e_o_s && os->lacing_fill==vals)os->header[5]|=0x04;
  os->b_o_s=1;

  /* 64 bits of PCM position */
  for(i=6;i<14;i++){
    os->header[i]=(unsigned char)(granule_pos&0xff);
    granule_pos>>=8;
  }

  /* 32 bits of stream serial number */
  {
    long serialno=os->serialno;
    for(i=14;i<18;i++){
      os->header[i]=(unsigned char)(serialno&0xff);
      serialno>>=8;
    }
  }

  /* 32 bits of page counter (we have both counter and page header
     because this val can roll over) */
  if(os->pageno==-1)os->pageno=0; /* because someone called
                                     stream_reset; this would be a
                                     strange thing to do in an
                                     encode stream, but it has
                                     plausible uses */
  {
    long pageno=os->pageno++;
    for(i=18;i<22;i++){
      os->header[i]=(unsigned char)(pageno&0xff);
      pageno>>=8;
    }
  }

  /* zero for computation; filled in later */
  os->header[22]=0;
  os->header[23]=0;
  os->header[24]=0;
  os->header[25]=0;

  /* segment table */
  os->header[26]=(unsigned char)(vals&0xff);
  for(i=0;i<vals;i++)
    bytes+=os->header[i+27]=(unsigned char)(os->lacing_vals[i]&0xff);

  /* set pointers in the ogg_page struct */
  og->header=os->header;
  og->header_len=os->header_fill=vals+27;
  og->body=os->body_data+os->body_returned;
  og->body_len=bytes;

  /* advance the lacing data and set the body_returned pointer */

  os->lacing_fill-=vals;
  memmove(os->lacing_vals,os->lacing_vals+vals,os->lacing_fill*sizeof(*os->lacing_vals));
  memmove(os->granule_vals,os->granule_vals+vals,os->lacing_fill*sizeof(*os->granule_vals));
  os->body_returned+=bytes;

  /* calculate the checksum */

  ogg_page_checksum_set(og);

  /* done */
  return(1);
}